

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

NAMED * lookup(XML_Parser parser,HASH_TABLE *table,KEY name,size_t createSize)

{
  ulong uVar1;
  char *pcVar2;
  unsigned_long uVar3;
  size_t sVar4;
  NAMED **ppNVar5;
  unsigned_long uVar6;
  NAMED *pNVar7;
  byte bVar8;
  byte bVar9;
  char cVar10;
  byte bVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  size_t __n;
  ulong uVar15;
  
  if (table->size == 0) {
    if (createSize == 0) {
      return (NAMED *)0x0;
    }
    table->power = '\x06';
    table->size = 0x40;
    ppNVar5 = (NAMED **)(*table->mem->malloc_fcn)(0x200);
    table->v = ppNVar5;
    if (ppNVar5 == (NAMED **)0x0) {
      table->size = 0;
      return (NAMED *)0x0;
    }
    memset(ppNVar5,0,0x200);
    uVar3 = hash(parser,name);
    uVar14 = table->size - 1 & uVar3;
  }
  else {
    uVar3 = hash(parser,name);
    sVar13 = table->size;
    uVar14 = sVar13 - 1 & uVar3;
    pNVar7 = table->v[uVar14];
    if (pNVar7 != (NAMED *)0x0) {
      bVar11 = 0;
      do {
        if (*name == *pNVar7->name) {
          lVar12 = 1;
          cVar10 = *name;
          do {
            if (cVar10 == '\0') {
              return pNVar7;
            }
            cVar10 = name[lVar12];
            pcVar2 = pNVar7->name + lVar12;
            lVar12 = lVar12 + 1;
          } while (cVar10 == *pcVar2);
        }
        if (bVar11 == 0) {
          bVar11 = (byte)((-sVar13 & uVar3) >> ((char)*(undefined4 *)&table->power - 1U & 0x3f)) &
                   (byte)(sVar13 - 1 >> 2) | 1;
        }
        sVar4 = 0;
        if (uVar14 < bVar11) {
          sVar4 = sVar13;
        }
        uVar14 = (uVar14 - bVar11) + sVar4;
        pNVar7 = table->v[uVar14];
      } while (pNVar7 != (NAMED *)0x0);
    }
    if (createSize == 0) {
      return (NAMED *)0x0;
    }
    bVar11 = (byte)*(undefined4 *)&table->power;
    if (table->used >> (bVar11 - 1 & 0x3f) != 0) {
      bVar9 = bVar11 + 1;
      sVar13 = 1L << (bVar9 & 0x3f);
      __n = 8L << (bVar9 & 0x3f);
      ppNVar5 = (NAMED **)(*table->mem->malloc_fcn)(__n);
      if (ppNVar5 == (NAMED **)0x0) {
        return (NAMED *)0x0;
      }
      uVar1 = sVar13 - 1;
      memset(ppNVar5,0,__n);
      uVar14 = table->size;
      if (uVar14 != 0) {
        uVar15 = 0;
        do {
          if (table->v[uVar15] != (NAMED *)0x0) {
            uVar6 = hash(parser,table->v[uVar15]->name);
            uVar14 = uVar6 & uVar1;
            if (ppNVar5[uVar14] != (NAMED *)0x0) {
              bVar8 = 0;
              do {
                if (bVar8 == 0) {
                  bVar8 = (byte)((uVar6 & -sVar13) >> (bVar11 & 0x3f)) & (byte)(uVar1 >> 2) | 1;
                }
                sVar4 = 0;
                if (uVar14 < bVar8) {
                  sVar4 = sVar13;
                }
                uVar14 = (uVar14 - bVar8) + sVar4;
              } while (ppNVar5[uVar14] != (NAMED *)0x0);
            }
            ppNVar5[uVar14] = table->v[uVar15];
            uVar14 = table->size;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < uVar14);
      }
      (*table->mem->free_fcn)(table->v);
      table->v = ppNVar5;
      table->power = bVar9;
      table->size = sVar13;
      uVar14 = uVar1 & uVar3;
      if (ppNVar5[uVar14] != (NAMED *)0x0) {
        uVar15 = 0;
        do {
          if ((char)uVar15 == '\0') {
            uVar15 = (ulong)(byte)((byte)((uVar3 & -sVar13) >> (bVar11 & 0x3f)) & (byte)(uVar1 >> 2)
                                  | 1);
          }
          sVar4 = 0;
          if (uVar14 < uVar15) {
            sVar4 = sVar13;
          }
          uVar14 = (uVar14 - uVar15) + sVar4;
        } while (ppNVar5[uVar14] != (NAMED *)0x0);
      }
    }
  }
  pNVar7 = (NAMED *)(*table->mem->malloc_fcn)(createSize);
  table->v[uVar14] = pNVar7;
  if (table->v[uVar14] == (NAMED *)0x0) {
    return (NAMED *)0x0;
  }
  memset(table->v[uVar14],0,createSize);
  ppNVar5 = table->v;
  ppNVar5[uVar14]->name = name;
  table->used = table->used + 1;
  return ppNVar5[uVar14];
}

Assistant:

static NAMED *
lookup(XML_Parser parser, HASH_TABLE *table, KEY name, size_t createSize)
{
  size_t i;
  if (table->size == 0) {
    size_t tsize;
    if (!createSize)
      return NULL;
    table->power = INIT_POWER;
    /* table->size is a power of 2 */
    table->size = (size_t)1 << INIT_POWER;
    tsize = table->size * sizeof(NAMED *);
    table->v = (NAMED **)table->mem->malloc_fcn(tsize);
    if (!table->v) {
      table->size = 0;
      return NULL;
    }
    memset(table->v, 0, tsize);
    i = hash(parser, name) & ((unsigned long)table->size - 1);
  }
  else {
    unsigned long h = hash(parser, name);
    unsigned long mask = (unsigned long)table->size - 1;
    unsigned char step = 0;
    i = h & mask;
    while (table->v[i]) {
      if (keyeq(name, table->v[i]->name))
        return table->v[i];
      if (!step)
        step = PROBE_STEP(h, mask, table->power);
      i < step ? (i += table->size - step) : (i -= step);
    }
    if (!createSize)
      return NULL;

    /* check for overflow (table is half full) */
    if (table->used >> (table->power - 1)) {
      unsigned char newPower = table->power + 1;
      size_t newSize = (size_t)1 << newPower;
      unsigned long newMask = (unsigned long)newSize - 1;
      size_t tsize = newSize * sizeof(NAMED *);
      NAMED **newV = (NAMED **)table->mem->malloc_fcn(tsize);
      if (!newV)
        return NULL;
      memset(newV, 0, tsize);
      for (i = 0; i < table->size; i++)
        if (table->v[i]) {
          unsigned long newHash = hash(parser, table->v[i]->name);
          size_t j = newHash & newMask;
          step = 0;
          while (newV[j]) {
            if (!step)
              step = PROBE_STEP(newHash, newMask, newPower);
            j < step ? (j += newSize - step) : (j -= step);
          }
          newV[j] = table->v[i];
        }
      table->mem->free_fcn(table->v);
      table->v = newV;
      table->power = newPower;
      table->size = newSize;
      i = h & newMask;
      step = 0;
      while (table->v[i]) {
        if (!step)
          step = PROBE_STEP(h, newMask, newPower);
        i < step ? (i += newSize - step) : (i -= step);
      }
    }
  }
  table->v[i] = (NAMED *)table->mem->malloc_fcn(createSize);
  if (!table->v[i])
    return NULL;
  memset(table->v[i], 0, createSize);
  table->v[i]->name = name;
  (table->used)++;
  return table->v[i];
}